

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

TimeInfo * __thiscall
absl::lts_20240722::TimeZone::At(TimeInfo *__return_storage_ptr__,TimeZone *this,CivilSecond ct)

{
  time_point<seconds> *cs_00;
  Time TVar1;
  Duration DVar2;
  TimeInfo *ti;
  HiRep local_90;
  uint32_t local_88;
  HiRep local_70;
  uint32_t local_68;
  int local_50 [2];
  civil_lookup cl;
  civil_second cs;
  TimeZone *this_local;
  CivilSecond ct_local;
  
  ct_local.f_.y = ct.f_._8_8_;
  this_local = (TimeZone *)ct.f_.y;
  time_internal::cctz::detail::
  civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::
  civil_time<absl::lts_20240722::time_internal::second_tag>
            ((civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> *)&cl.post,
             (civil_time<absl::lts_20240722::time_internal::second_tag> *)&this_local,
             (preserves_data<absl::lts_20240722::time_internal::cctz::detail::second_tag,_absl::lts_20240722::time_internal::second_tag>
              *)0x0);
  absl::lts_20240722::time_internal::cctz::time_zone::lookup((civil_time *)local_50);
  TimeInfo::TimeInfo(__return_storage_ptr__);
  if (local_50[0] == 0) {
    __return_storage_ptr__->kind = UNIQUE;
  }
  else if (local_50[0] == 1) {
    __return_storage_ptr__->kind = SKIPPED;
  }
  else if (local_50[0] == 2) {
    __return_storage_ptr__->kind = REPEATED;
  }
  cs_00 = &cl.post;
  TVar1 = anon_unknown_8::MakeTimeWithOverflow
                    ((time_point<cctz::seconds> *)&cl,(civil_second *)cs_00,&this->cz_,(bool *)0x0);
  local_68 = TVar1.rep_.rep_lo_;
  local_70 = TVar1.rep_.rep_hi_;
  (__return_storage_ptr__->pre).rep_.rep_lo_ = local_68;
  (__return_storage_ptr__->pre).rep_.rep_hi_ = local_70;
  TVar1 = anon_unknown_8::MakeTimeWithOverflow(&cl.pre,(civil_second *)cs_00,&this->cz_,(bool *)0x0)
  ;
  local_88 = TVar1.rep_.rep_lo_;
  local_90 = TVar1.rep_.rep_hi_;
  (__return_storage_ptr__->trans).rep_.rep_lo_ = local_88;
  (__return_storage_ptr__->trans).rep_.rep_hi_ = local_90;
  DVar2 = (Duration)
          anon_unknown_8::MakeTimeWithOverflow
                    (&cl.trans,(civil_second *)cs_00,&this->cz_,(bool *)0x0);
  (__return_storage_ptr__->post).rep_ = DVar2;
  return __return_storage_ptr__;
}

Assistant:

absl::TimeZone::TimeInfo TimeZone::At(CivilSecond ct) const {
  const cctz::civil_second cs(ct);
  const auto cl = cz_.lookup(cs);

  TimeZone::TimeInfo ti;
  switch (cl.kind) {
    case cctz::time_zone::civil_lookup::UNIQUE:
      ti.kind = TimeZone::TimeInfo::UNIQUE;
      break;
    case cctz::time_zone::civil_lookup::SKIPPED:
      ti.kind = TimeZone::TimeInfo::SKIPPED;
      break;
    case cctz::time_zone::civil_lookup::REPEATED:
      ti.kind = TimeZone::TimeInfo::REPEATED;
      break;
  }
  ti.pre = MakeTimeWithOverflow(cl.pre, cs, cz_);
  ti.trans = MakeTimeWithOverflow(cl.trans, cs, cz_);
  ti.post = MakeTimeWithOverflow(cl.post, cs, cz_);
  return ti;
}